

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O0

void __thiscall Company::~Company(Company *this)

{
  Employee *this_00;
  Boss *this_01;
  int iVar1;
  int local_14;
  int i;
  Company *this_local;
  
  local_14 = 0;
  while( true ) {
    iVar1 = Boss::getNumberOfEmployees(this->boss);
    if (iVar1 <= local_14) break;
    this_00 = this->employees[local_14];
    if (this_00 != (Employee *)0x0) {
      Employee::~Employee(this_00);
      operator_delete(this_00,0xb8);
    }
    local_14 = local_14 + 1;
  }
  this_01 = this->boss;
  if (this_01 != (Boss *)0x0) {
    Boss::~Boss(this_01);
    operator_delete(this_01,0xc0);
  }
  if (this->employees != (Employee **)0x0) {
    operator_delete__(this->employees);
  }
  return;
}

Assistant:

Company::~Company() {
    for (int i = 0; i < boss->getNumberOfEmployees(); ++i) {
        delete employees[i];
    }
    delete boss;
    delete[] employees;
}